

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

SparseBVUnit * __thiscall
BVSparse<Memory::HeapAllocator>::BitsFromIndex(BVSparse<Memory::HeapAllocator> *this,BVIndex i)

{
  BVSparseNode *pBVar1;
  BVSparseNode *node;
  Type_conflict *prevNextField;
  BVSparse<Memory::HeapAllocator> *pBStack_18;
  BVIndex i_local;
  BVSparse<Memory::HeapAllocator> *this_local;
  
  node = (BVSparseNode *)0x0;
  prevNextField._4_4_ = i;
  pBStack_18 = this;
  pBVar1 = NodeFromIndex(this,i,(Type_conflict **)&node);
  if (pBVar1 == (BVSparseNode *)0x0) {
    this_local = (BVSparse<Memory::HeapAllocator> *)&s_EmptyUnit;
  }
  else {
    this_local = (BVSparse<Memory::HeapAllocator> *)&pBVar1->data;
  }
  return (SparseBVUnit *)this_local;
}

Assistant:

const SparseBVUnit *
BVSparse<TAllocator>::BitsFromIndex(BVIndex i) const
{
    Field(BVSparseNode*, TAllocator) const* prevNextField = nullptr;
    const BVSparseNode * node = NodeFromIndex(i, &prevNextField);
    if (node)
    {
        return &node->data;
    }
    else
    {
        return (SparseBVUnit *)&BVSparse::s_EmptyUnit;
    }
}